

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ContainsFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  ScalarFunction map_fun;
  ScalarFunction list_fun;
  ScalarFunction string_fun;
  allocator local_721;
  string local_720;
  ScalarFunction local_700;
  ScalarFunction local_5d8;
  ScalarFunction local_4b0;
  ScalarFunction local_388;
  ScalarFunction local_260;
  ScalarFunction local_138;
  
  GetStringContains();
  ListContainsFun::GetFunction();
  MapContainsFun::GetFunction();
  ::std::__cxx11::string::string((string *)&local_720,"contains",&local_721);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_720);
  ::std::__cxx11::string::~string((string *)&local_720);
  ScalarFunction::ScalarFunction(&local_4b0,&local_138);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4b0);
  ScalarFunction::~ScalarFunction(&local_4b0);
  ScalarFunction::ScalarFunction(&local_5d8,&local_260);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5d8);
  ScalarFunction::~ScalarFunction(&local_5d8);
  ScalarFunction::ScalarFunction(&local_700,&local_388);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_700);
  ScalarFunction::~ScalarFunction(&local_700);
  ScalarFunction::~ScalarFunction(&local_388);
  ScalarFunction::~ScalarFunction(&local_260);
  ScalarFunction::~ScalarFunction(&local_138);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ContainsFun::GetFunctions() {
	auto string_fun = GetStringContains();
	auto list_fun = ListContainsFun::GetFunction();
	auto map_fun = MapContainsFun::GetFunction();
	ScalarFunctionSet set("contains");
	set.AddFunction(string_fun);
	set.AddFunction(list_fun);
	set.AddFunction(map_fun);
	return set;
}